

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isNearestSampleResultValid<tcu::LookupPrecision,float>
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,float coordX,
               int coordY,Vector<float,_4> *result)

{
  WrapMode mode;
  bool bVar1;
  int iVar2;
  int coordBits;
  int uvBits;
  deInt32 dVar3;
  float fVar4;
  float x_00;
  undefined1 local_60 [8];
  Vector<float,_4> color;
  int x;
  int i;
  int maxI;
  int minI;
  Vec2 uBounds;
  Vector<float,_4> *result_local;
  int coordY_local;
  float coordX_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  bVar1 = sampler->normalizedCoords;
  uBounds.m_data = (float  [2])result;
  iVar2 = ConstPixelBufferAccess::getWidth(level);
  coordBits = Vector<int,_3>::x(&prec->coordBits);
  uvBits = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar1 & 1),iVar2,coordX,coordBits,uvBits);
  fVar4 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  fVar4 = (float)deFloorFloatToInt32(fVar4);
  x_00 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar3 = deFloorFloatToInt32(x_00);
  color.m_data[3] = fVar4;
  while( true ) {
    fVar4 = color.m_data[3];
    if (dVar3 < (int)color.m_data[3]) {
      return false;
    }
    mode = sampler->wrapS;
    iVar2 = ConstPixelBufferAccess::getWidth(level);
    color.m_data[2] = (float)TexVerifierUtil::wrap(mode,(int)fVar4,iVar2);
    lookup<float>((tcu *)local_60,level,sampler,(int)color.m_data[2],coordY,0);
    bVar1 = isColorValid(prec,(Vec4 *)local_60,(Vec4 *)uBounds.m_data);
    if (bVar1) break;
    color.m_data[3] = (float)((int)color.m_data[3] + 1);
  }
  return true;
}

Assistant:

static bool isNearestSampleResultValid (const ConstPixelBufferAccess&		level,
										const Sampler&						sampler,
										const PrecType&						prec,
										const float							coordX,
										const int							coordY,
										const Vector<ScalarType, 4>&		result)
{
	DE_ASSERT(level.getDepth() == 1);

	const Vec2		uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coordX, prec.coordBits.x(), prec.uvwBits.x());

	const int		minI			= deFloorFloatToInt32(uBounds.x());
	const int		maxI			= deFloorFloatToInt32(uBounds.y());

	for (int i = minI; i <= maxI; i++)
	{
		const int					x		= wrap(sampler.wrapS, i, level.getWidth());
		const Vector<ScalarType, 4>	color	= lookup<ScalarType>(level, sampler, x, coordY, 0);

		if (isColorValid(prec, color, result))
			return true;
	}

	return false;
}